

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O1

void __thiscall
google::protobuf::DescriptorBuilder::DetectMapConflicts
          (DescriptorBuilder *this,Descriptor *message,DescriptorProto *proto)

{
  byte *pbVar1;
  ushort *puVar2;
  Descriptor *pDVar3;
  char *pcVar4;
  uint uVar5;
  ushort uVar6;
  FunctionRef<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
  make_error;
  FunctionRef<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
  make_error_00;
  FunctionRef<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
  make_error_01;
  FunctionRef<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
  make_error_02;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  byte bVar9;
  byte bVar10;
  byte bVar11;
  byte bVar12;
  byte bVar13;
  byte bVar14;
  byte bVar15;
  byte bVar16;
  byte bVar17;
  byte bVar18;
  byte bVar19;
  byte bVar20;
  byte bVar21;
  byte bVar22;
  byte bVar23;
  byte bVar24;
  anon_union_8_1_a8a14541_for_iterator_2 aVar25;
  byte bVar26;
  byte bVar27;
  byte bVar28;
  byte bVar29;
  byte bVar30;
  byte bVar31;
  byte bVar32;
  byte bVar33;
  undefined1 uVar34;
  ushort uVar36;
  Descriptor **key;
  bool bVar35;
  uint64_t uVar37;
  slot_type *ppDVar38;
  ctrl_t *pcVar39;
  size_t i;
  size_t sVar40;
  anon_union_8_1_a8a14541_for_iterator_2 aVar41;
  reference ppDVar42;
  Value<google::protobuf::internal::GenericTypeHandler<google::protobuf::DescriptorProto>_>
  *proto_00;
  Nonnull<const_char_*> failure_msg;
  uint uVar43;
  anon_union_8_1_a8a14541_for_iterator_2 aVar44;
  Descriptor *rhs;
  Descriptor *rhs_00;
  Descriptor *rhs_01;
  Descriptor *rhs_02;
  uint64_t v;
  char cVar45;
  PolicyFunctions *in_R9;
  ulong uVar46;
  CommonFields *common;
  undefined1 *puVar47;
  ulong uVar48;
  long lVar49;
  long lVar50;
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  iterator iVar55;
  iterator iVar56;
  string_view element_name;
  string_view element_name_00;
  string_view element_name_01;
  string_view element_name_02;
  FindInfo target;
  pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::Descriptor_*>,_google::protobuf::(anonymous_namespace)::DescriptorsByNameHash<google::protobuf::Descriptor>,_google::protobuf::(anonymous_namespace)::DescriptorsByNameEq<google::protobuf::Descriptor>,_std::allocator<const_google::protobuf::Descriptor_*>_>::iterator,_bool>
  insert_result;
  Descriptor *nested;
  DescriptorsByNameSet<Descriptor> seen_types;
  __m128i match;
  __m128i match_1;
  anon_union_8_1_a8a14541_for_iterator_2 local_198;
  anon_union_8_1_a8a14541_for_iterator_2 local_190;
  char local_188;
  anon_union_8_1_a8a14541_for_iterator_2 local_180;
  anon_union_8_1_a8a14541_for_iterator_2 local_178;
  Descriptor *local_170;
  iterator local_168;
  CommonFields local_158;
  anon_union_8_1_a8a14541_for_iterator_2 local_138;
  DescriptorProto *local_130;
  DescriptorBuilder *local_128;
  CommonFields *local_120;
  long local_118;
  anon_union_8_1_a8a14541_for_iterator_2 local_110;
  undefined1 local_108 [16];
  slot_type *local_f0;
  undefined8 local_e8;
  byte bStack_e0;
  byte bStack_df;
  byte bStack_de;
  byte bStack_dd;
  byte bStack_dc;
  byte bStack_db;
  byte bStack_da;
  byte bStack_d9;
  undefined8 local_d8;
  ctrl_t cStack_d0;
  ctrl_t cStack_cf;
  ctrl_t cStack_ce;
  ctrl_t cStack_cd;
  ctrl_t cStack_cc;
  ctrl_t cStack_cb;
  ctrl_t cStack_ca;
  ctrl_t cStack_c9;
  anon_union_8_1_a8a14541_for_iterator_2 local_c0;
  RepeatedPtrFieldBase *local_b8;
  long local_b0;
  VoidPtr local_a8;
  code *pcStack_a0;
  VoidPtr local_98;
  code *pcStack_90;
  VoidPtr local_88;
  code *pcStack_80;
  VoidPtr local_78;
  code *pcStack_70;
  anon_union_8_1_a8a14541_for_iterator_2 local_68;
  anon_union_8_1_a8a14541_for_iterator_2 local_60;
  iterator local_58;
  undefined4 local_48;
  undefined4 uStack_44;
  undefined4 uStack_40;
  undefined4 uStack_3c;
  
  local_158.capacity_ = 1;
  local_158.size_ = 0;
  local_170 = message;
  local_130 = proto;
  local_128 = this;
  if (0 < message->nested_type_count_) {
    local_b8 = (RepeatedPtrFieldBase *)((long)&proto->field_0 + 0x20);
    lVar50 = 0;
    do {
      local_b0 = lVar50 * 0xa0;
      local_168.ctrl_ = (ctrl_t *)(message->nested_types_ + lVar50);
      absl::lts_20250127::container_internal::
      raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::Descriptor_const*>,google::protobuf::(anonymous_namespace)::DescriptorsByNameHash<google::protobuf::Descriptor>,google::protobuf::(anonymous_namespace)::DescriptorsByNameEq<google::protobuf::Descriptor>,std::allocator<google::protobuf::Descriptor_const*>>
      ::AssertOnFind<google::protobuf::Descriptor_const*>
                ((raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::Descriptor_const*>,google::protobuf::(anonymous_namespace)::DescriptorsByNameHash<google::protobuf::Descriptor>,google::protobuf::(anonymous_namespace)::DescriptorsByNameEq<google::protobuf::Descriptor>,std::allocator<google::protobuf::Descriptor_const*>>
                  *)&local_158,(Descriptor **)&local_168);
      if ((slot_type *)local_158.capacity_ == (slot_type *)0x1) {
        absl::lts_20250127::container_internal::
        raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::Descriptor_*>,_google::protobuf::(anonymous_namespace)::DescriptorsByNameHash<google::protobuf::Descriptor>,_google::protobuf::(anonymous_namespace)::DescriptorsByNameEq<google::protobuf::Descriptor>,_std::allocator<const_google::protobuf::Descriptor_*>_>
        ::AssertNotDebugCapacity
                  ((raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::Descriptor_*>,_google::protobuf::(anonymous_namespace)::DescriptorsByNameHash<google::protobuf::Descriptor>,_google::protobuf::(anonymous_namespace)::DescriptorsByNameEq<google::protobuf::Descriptor>,_std::allocator<const_google::protobuf::Descriptor_*>_>
                    *)&local_158);
        if (local_158.size_ < 2) {
          if ((slot_type *)local_158.capacity_ != (slot_type *)0x1) {
            iVar55 = _local_198;
            cVar45 = local_188;
            if ((slot_type *)local_158.capacity_ != (slot_type *)0x0) {
              __assert_fail("(is_soo()) && \"Try enabling sanitizers.\"",
                            "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                            ,0xe3f,
                            "HashtablezInfoHandle absl::container_internal::raw_hash_set<absl::container_internal::FlatHashSetPolicy<const google::protobuf::Descriptor *>, google::protobuf::(anonymous namespace)::DescriptorsByNameHash<google::protobuf::Descriptor>, google::protobuf::(anonymous namespace)::DescriptorsByNameEq<google::protobuf::Descriptor>, std::allocator<const google::protobuf::Descriptor *>>::try_sample_soo() [Policy = absl::container_internal::FlatHashSetPolicy<const google::protobuf::Descriptor *>, Hash = google::protobuf::(anonymous namespace)::DescriptorsByNameHash<google::protobuf::Descriptor>, Eq = google::protobuf::(anonymous namespace)::DescriptorsByNameEq<google::protobuf::Descriptor>, Alloc = std::allocator<const google::protobuf::Descriptor *>]"
                           );
            }
            goto LAB_003a2bb5;
          }
          absl::lts_20250127::container_internal::CommonFields::AssertInSooMode(&local_158);
          local_158.size_ = 2;
          local_190.slot_ =
               absl::lts_20250127::container_internal::
               raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::Descriptor_*>,_google::protobuf::(anonymous_namespace)::DescriptorsByNameHash<google::protobuf::Descriptor>,_google::protobuf::(anonymous_namespace)::DescriptorsByNameEq<google::protobuf::Descriptor>,_std::allocator<const_google::protobuf::Descriptor_*>_>
               ::soo_slot((raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::Descriptor_*>,_google::protobuf::(anonymous_namespace)::DescriptorsByNameHash<google::protobuf::Descriptor>,_google::protobuf::(anonymous_namespace)::DescriptorsByNameEq<google::protobuf::Descriptor>,_std::allocator<const_google::protobuf::Descriptor_*>_>
                           *)&local_158);
          local_198 = (anon_union_8_1_a8a14541_for_iterator_2)
                      absl::lts_20250127::container_internal::kSooControl;
        }
        else {
          ppDVar38 = absl::lts_20250127::container_internal::
                     raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::Descriptor_*>,_google::protobuf::(anonymous_namespace)::DescriptorsByNameHash<google::protobuf::Descriptor>,_google::protobuf::(anonymous_namespace)::DescriptorsByNameEq<google::protobuf::Descriptor>,_std::allocator<const_google::protobuf::Descriptor_*>_>
                     ::soo_slot((raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::Descriptor_*>,_google::protobuf::(anonymous_namespace)::DescriptorsByNameHash<google::protobuf::Descriptor>,_google::protobuf::(anonymous_namespace)::DescriptorsByNameEq<google::protobuf::Descriptor>,_std::allocator<const_google::protobuf::Descriptor_*>_>
                                 *)&local_158);
          bVar35 = anon_unknown_24::DescriptorsByNameEq<google::protobuf::Descriptor>::operator()
                             ((DescriptorsByNameEq<google::protobuf::Descriptor> *)*ppDVar38,
                              (Descriptor *)local_168.ctrl_,rhs_00);
          if (bVar35) {
            local_190.slot_ =
                 absl::lts_20250127::container_internal::
                 raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::Descriptor_*>,_google::protobuf::(anonymous_namespace)::DescriptorsByNameHash<google::protobuf::Descriptor>,_google::protobuf::(anonymous_namespace)::DescriptorsByNameEq<google::protobuf::Descriptor>,_std::allocator<const_google::protobuf::Descriptor_*>_>
                 ::soo_slot((raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::Descriptor_*>,_google::protobuf::(anonymous_namespace)::DescriptorsByNameHash<google::protobuf::Descriptor>,_google::protobuf::(anonymous_namespace)::DescriptorsByNameEq<google::protobuf::Descriptor>,_std::allocator<const_google::protobuf::Descriptor_*>_>
                             *)&local_158);
            local_198 = (anon_union_8_1_a8a14541_for_iterator_2)
                        absl::lts_20250127::container_internal::kSooControl;
            local_188 = '\0';
            iVar55 = _local_198;
            cVar45 = local_188;
            goto LAB_003a23b0;
          }
          absl::lts_20250127::container_internal::
          raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::Descriptor_*>,_google::protobuf::(anonymous_namespace)::DescriptorsByNameHash<google::protobuf::Descriptor>,_google::protobuf::(anonymous_namespace)::DescriptorsByNameEq<google::protobuf::Descriptor>,_std::allocator<const_google::protobuf::Descriptor_*>_>
          ::resize_impl(&local_158,3);
          puVar2 = (ushort *)((DescriptorNames *)((long)local_168.ctrl_ + 0x10))->payload_;
          uVar46 = (ulong)*puVar2;
          uVar37 = absl::lts_20250127::hash_internal::MixingHashState::CombineContiguousImpl
                             (&absl::lts_20250127::hash_internal::MixingHashState::kSeed,
                              (long)puVar2 + ~uVar46,uVar46);
          uVar46 = (uVar37 ^ uVar46) * -0x234dd359734ecb13;
          sVar40 = absl::lts_20250127::container_internal::PrepareInsertAfterSoo
                             (uVar46 >> 0x38 | (uVar46 & 0xff000000000000) >> 0x28 |
                              (uVar46 & 0xff0000000000) >> 0x18 | (uVar46 & 0xff00000000) >> 8 |
                              (uVar46 & 0xff000000) << 8 | (uVar46 & 0xff0000) << 0x18 |
                              (uVar46 & 0xff00) << 0x28 | uVar46 << 0x38,8,&local_158);
          _local_198 = absl::lts_20250127::container_internal::
                       raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::Descriptor_*>,_google::protobuf::(anonymous_namespace)::DescriptorsByNameHash<google::protobuf::Descriptor>,_google::protobuf::(anonymous_namespace)::DescriptorsByNameEq<google::protobuf::Descriptor>,_std::allocator<const_google::protobuf::Descriptor_*>_>
                       ::iterator_at((raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::Descriptor_*>,_google::protobuf::(anonymous_namespace)::DescriptorsByNameHash<google::protobuf::Descriptor>,_google::protobuf::(anonymous_namespace)::DescriptorsByNameEq<google::protobuf::Descriptor>,_std::allocator<const_google::protobuf::Descriptor_*>_>
                                      *)&local_158,sVar40);
        }
        local_188 = '\x01';
        iVar55 = _local_198;
        cVar45 = local_188;
      }
      else {
        iVar55 = _local_198;
        cVar45 = local_188;
        if ((slot_type *)local_158.capacity_ == (slot_type *)0x0) goto LAB_003a2bb5;
        absl::lts_20250127::container_internal::
        raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::Descriptor_*>,_google::protobuf::(anonymous_namespace)::DescriptorsByNameHash<google::protobuf::Descriptor>,_google::protobuf::(anonymous_namespace)::DescriptorsByNameEq<google::protobuf::Descriptor>,_std::allocator<const_google::protobuf::Descriptor_*>_>
        ::prefetch_heap_block
                  ((raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::Descriptor_*>,_google::protobuf::(anonymous_namespace)::DescriptorsByNameHash<google::protobuf::Descriptor>,_google::protobuf::(anonymous_namespace)::DescriptorsByNameEq<google::protobuf::Descriptor>,_std::allocator<const_google::protobuf::Descriptor_*>_>
                    *)&local_158);
        puVar2 = (ushort *)((DescriptorNames *)((long)local_168.ctrl_ + 0x10))->payload_;
        uVar46 = (ulong)*puVar2;
        uVar37 = absl::lts_20250127::hash_internal::MixingHashState::CombineContiguousImpl
                           (&absl::lts_20250127::hash_internal::MixingHashState::kSeed,
                            (long)puVar2 + ~uVar46,uVar46);
        sVar40 = local_158.capacity_;
        local_118 = lVar50;
        if (((ulong)(local_158.capacity_ + 1) & local_158.capacity_) != 0) goto LAB_003a2b44;
        uVar46 = (uVar37 ^ uVar46) * -0x234dd359734ecb13;
        common = (CommonFields *)
                 (uVar46 >> 0x38 | (uVar46 & 0xff000000000000) >> 0x28 |
                  (uVar46 & 0xff0000000000) >> 0x18 | (uVar46 & 0xff00000000) >> 8 |
                  (uVar46 & 0xff000000) << 8 | (uVar46 & 0xff0000) << 0x18 |
                  (uVar46 & 0xff00) << 0x28 | uVar46 << 0x38);
        uVar48 = ((ulong)common >> 7 ^ (ulong)local_158.heap_or_soo_.heap.control >> 0xc) &
                 local_158.capacity_;
        local_120 = (CommonFields *)
                    absl::lts_20250127::container_internal::
                    raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::Descriptor_*>,_google::protobuf::(anonymous_namespace)::DescriptorsByNameHash<google::protobuf::Descriptor>,_google::protobuf::(anonymous_namespace)::DescriptorsByNameEq<google::protobuf::Descriptor>,_std::allocator<const_google::protobuf::Descriptor_*>_>
                    ::control((raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::Descriptor_*>,_google::protobuf::(anonymous_namespace)::DescriptorsByNameHash<google::protobuf::Descriptor>,_google::protobuf::(anonymous_namespace)::DescriptorsByNameEq<google::protobuf::Descriptor>,_std::allocator<const_google::protobuf::Descriptor_*>_>
                               *)&local_158);
        uVar34 = (undefined1)(uVar46 >> 0x38);
        auVar51 = ZEXT216(CONCAT11(uVar34,uVar34) & 0x7f7f);
        auVar51 = pshuflw(auVar51,auVar51,0);
        local_108._0_4_ = auVar51._0_4_;
        local_108._4_4_ = local_108._0_4_;
        local_108._8_4_ = local_108._0_4_;
        local_108._12_4_ = local_108._0_4_;
        aVar41.slot_ = (slot_type *)0x0;
        cVar45 = local_188;
        iVar55 = _local_198;
        do {
          aVar44 = iVar55.field_1;
          pbVar1 = (byte *)((long)&local_120->capacity_ + uVar48);
          auVar51[0] = -(local_108[0] == *pbVar1);
          auVar51[1] = -(local_108[1] == pbVar1[1]);
          auVar51[2] = -(local_108[2] == pbVar1[2]);
          auVar51[3] = -(local_108[3] == pbVar1[3]);
          auVar51[4] = -(local_108[4] == pbVar1[4]);
          auVar51[5] = -(local_108[5] == pbVar1[5]);
          auVar51[6] = -(local_108[6] == pbVar1[6]);
          auVar51[7] = -(local_108[7] == pbVar1[7]);
          auVar51[8] = -(local_108[8] == pbVar1[8]);
          auVar51[9] = -(local_108[9] == pbVar1[9]);
          auVar51[10] = -(local_108[10] == pbVar1[10]);
          auVar51[0xb] = -(local_108[0xb] == pbVar1[0xb]);
          auVar51[0xc] = -(local_108[0xc] == pbVar1[0xc]);
          auVar51[0xd] = -(local_108[0xd] == pbVar1[0xd]);
          auVar51[0xe] = -(local_108[0xe] == pbVar1[0xe]);
          auVar51[0xf] = -(local_108[0xf] == pbVar1[0xf]);
          uVar36 = (ushort)(SUB161(auVar51 >> 7,0) & 1) |
                   (ushort)(SUB161(auVar51 >> 0xf,0) & 1) << 1 |
                   (ushort)(SUB161(auVar51 >> 0x17,0) & 1) << 2 |
                   (ushort)(SUB161(auVar51 >> 0x1f,0) & 1) << 3 |
                   (ushort)(SUB161(auVar51 >> 0x27,0) & 1) << 4 |
                   (ushort)(SUB161(auVar51 >> 0x2f,0) & 1) << 5 |
                   (ushort)(SUB161(auVar51 >> 0x37,0) & 1) << 6 |
                   (ushort)(SUB161(auVar51 >> 0x3f,0) & 1) << 7 |
                   (ushort)(SUB161(auVar51 >> 0x47,0) & 1) << 8 |
                   (ushort)(SUB161(auVar51 >> 0x4f,0) & 1) << 9 |
                   (ushort)(SUB161(auVar51 >> 0x57,0) & 1) << 10 |
                   (ushort)(SUB161(auVar51 >> 0x5f,0) & 1) << 0xb |
                   (ushort)(SUB161(auVar51 >> 0x67,0) & 1) << 0xc |
                   (ushort)(SUB161(auVar51 >> 0x6f,0) & 1) << 0xd |
                   (ushort)(SUB161(auVar51 >> 0x77,0) & 1) << 0xe |
                   (ushort)(auVar51[0xf] >> 7) << 0xf;
          uVar43 = (uint)uVar36;
          aVar25 = (anon_union_8_1_a8a14541_for_iterator_2)iVar55.ctrl_;
          local_168.field_1 = aVar41;
          bVar9 = *pbVar1;
          bVar10 = pbVar1[1];
          bVar11 = pbVar1[2];
          bVar12 = pbVar1[3];
          bVar13 = pbVar1[4];
          bVar14 = pbVar1[5];
          bVar15 = pbVar1[6];
          bVar16 = pbVar1[7];
          bVar26 = pbVar1[8];
          bVar27 = pbVar1[9];
          bVar28 = pbVar1[10];
          bVar29 = pbVar1[0xb];
          bVar30 = pbVar1[0xc];
          bVar31 = pbVar1[0xd];
          bVar32 = pbVar1[0xe];
          bVar33 = pbVar1[0xf];
          ppDVar38 = (slot_type *)local_158.capacity_;
          aVar41 = local_138;
          pcVar39 = local_e8;
          bVar17 = bStack_e0;
          bVar18 = bStack_df;
          bVar19 = bStack_de;
          bVar20 = bStack_dd;
          bVar21 = bStack_dc;
          bVar22 = bStack_db;
          bVar23 = bStack_da;
          bVar24 = bStack_d9;
          local_e8 = *(ctrl_t **)pbVar1;
          while (bStack_d9 = bVar33, bStack_da = bVar32, bStack_db = bVar31, bStack_dc = bVar30,
                bStack_dd = bVar29, bStack_de = bVar28, bStack_df = bVar27, bStack_e0 = bVar26,
                local_138 = aVar25, local_158.capacity_ = (size_t)ppDVar38, uVar36 != 0) {
            uVar5 = 0;
            if (uVar43 != 0) {
              for (; (uVar43 >> uVar5 & 1) == 0; uVar5 = uVar5 + 1) {
              }
            }
            local_d8 = common;
            ppDVar38 = absl::lts_20250127::container_internal::
                       raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::Descriptor_*>,_google::protobuf::(anonymous_namespace)::DescriptorsByNameHash<google::protobuf::Descriptor>,_google::protobuf::(anonymous_namespace)::DescriptorsByNameEq<google::protobuf::Descriptor>,_std::allocator<const_google::protobuf::Descriptor_*>_>
                       ::slot_array((raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::Descriptor_*>,_google::protobuf::(anonymous_namespace)::DescriptorsByNameHash<google::protobuf::Descriptor>,_google::protobuf::(anonymous_namespace)::DescriptorsByNameEq<google::protobuf::Descriptor>,_std::allocator<const_google::protobuf::Descriptor_*>_>
                                     *)&local_158);
            uVar46 = uVar5 + uVar48 & sVar40;
            bVar35 = anon_unknown_24::DescriptorsByNameEq<google::protobuf::Descriptor>::operator()
                               ((DescriptorsByNameEq<google::protobuf::Descriptor> *)
                                ppDVar38[uVar46],(Descriptor *)local_168.ctrl_,rhs);
            if (bVar35) {
              local_190.slot_ = aVar44.slot_;
              local_198.slot_ = local_138.slot_;
              local_188 = cVar45;
              iVar55 = absl::lts_20250127::container_internal::
                       raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::Descriptor_*>,_google::protobuf::(anonymous_namespace)::DescriptorsByNameHash<google::protobuf::Descriptor>,_google::protobuf::(anonymous_namespace)::DescriptorsByNameEq<google::protobuf::Descriptor>,_std::allocator<const_google::protobuf::Descriptor_*>_>
                       ::iterator_at((raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::Descriptor_*>,_google::protobuf::(anonymous_namespace)::DescriptorsByNameHash<google::protobuf::Descriptor>,_google::protobuf::(anonymous_namespace)::DescriptorsByNameEq<google::protobuf::Descriptor>,_std::allocator<const_google::protobuf::Descriptor_*>_>
                                      *)&local_158,uVar46);
              local_188 = '\0';
              message = local_170;
              lVar50 = local_118;
              cVar45 = local_188;
              goto LAB_003a23b0;
            }
            uVar36 = (ushort)(uVar43 - 1) & (ushort)uVar43;
            uVar43 = CONCAT22((short)(uVar43 - 1 >> 0x10),uVar36);
            iVar55.field_1.slot_ = aVar44.slot_;
            iVar55.ctrl_ = (ctrl_t *)local_138.slot_;
            aVar25 = local_138;
            common = local_d8;
            bVar9 = (byte)local_e8;
            bVar10 = local_e8._1_1_;
            bVar11 = local_e8._2_1_;
            bVar12 = local_e8._3_1_;
            bVar13 = local_e8._4_1_;
            bVar14 = local_e8._5_1_;
            bVar15 = local_e8._6_1_;
            bVar16 = local_e8._7_1_;
            bVar26 = bStack_e0;
            bVar27 = bStack_df;
            bVar28 = bStack_de;
            bVar29 = bStack_dd;
            bVar30 = bStack_dc;
            bVar31 = bStack_db;
            bVar32 = bStack_da;
            bVar33 = bStack_d9;
            ppDVar38 = (slot_type *)local_158.capacity_;
            aVar41 = local_138;
            pcVar39 = local_e8;
            bVar17 = bStack_e0;
            bVar18 = bStack_df;
            bVar19 = bStack_de;
            bVar20 = bStack_dd;
            bVar21 = bStack_dc;
            bVar22 = bStack_db;
            bVar23 = bStack_da;
            bVar24 = bStack_d9;
          }
          auVar54[0] = -(bVar9 == 0x80);
          auVar54[1] = -(bVar10 == 0x80);
          auVar54[2] = -(bVar11 == 0x80);
          auVar54[3] = -(bVar12 == 0x80);
          auVar54[4] = -(bVar13 == 0x80);
          auVar54[5] = -(bVar14 == 0x80);
          auVar54[6] = -(bVar15 == 0x80);
          auVar54[7] = -(bVar16 == 0x80);
          auVar54[8] = -(bStack_e0 == 0x80);
          auVar54[9] = -(bStack_df == 0x80);
          auVar54[10] = -(bStack_de == 0x80);
          auVar54[0xb] = -(bStack_dd == 0x80);
          auVar54[0xc] = -(bStack_dc == 0x80);
          auVar54[0xd] = -(bStack_db == 0x80);
          auVar54[0xe] = -(bStack_da == 0x80);
          auVar54[0xf] = -(bStack_d9 == 0x80);
          uVar36 = (ushort)(SUB161(auVar54 >> 7,0) & 1) |
                   (ushort)(SUB161(auVar54 >> 0xf,0) & 1) << 1 |
                   (ushort)(SUB161(auVar54 >> 0x17,0) & 1) << 2 |
                   (ushort)(SUB161(auVar54 >> 0x1f,0) & 1) << 3 |
                   (ushort)(SUB161(auVar54 >> 0x27,0) & 1) << 4 |
                   (ushort)(SUB161(auVar54 >> 0x2f,0) & 1) << 5 |
                   (ushort)(SUB161(auVar54 >> 0x37,0) & 1) << 6 |
                   (ushort)(SUB161(auVar54 >> 0x3f,0) & 1) << 7 |
                   (ushort)(SUB161(auVar54 >> 0x47,0) & 1) << 8 |
                   (ushort)(SUB161(auVar54 >> 0x4f,0) & 1) << 9 |
                   (ushort)(SUB161(auVar54 >> 0x57,0) & 1) << 10 |
                   (ushort)(SUB161(auVar54 >> 0x5f,0) & 1) << 0xb |
                   (ushort)(SUB161(auVar54 >> 0x67,0) & 1) << 0xc |
                   (ushort)(SUB161(auVar54 >> 0x6f,0) & 1) << 0xd |
                   (ushort)(SUB161(auVar54 >> 0x77,0) & 1) << 0xe |
                   (ushort)(auVar54[0xf] >> 7) << 0xf;
          local_138 = aVar41;
          local_e8 = pcVar39;
          bStack_e0 = bVar17;
          bStack_df = bVar18;
          bStack_de = bVar19;
          bStack_dd = bVar20;
          bStack_dc = bVar21;
          bStack_db = bVar22;
          bStack_da = bVar23;
          bStack_d9 = bVar24;
          if (uVar36 == 0) {
            if (ppDVar38 == (slot_type *)0x0) goto LAB_003a2bb5;
            aVar41.slot_ = local_168.field_1.slot_ + 2;
            if (ppDVar38 < aVar41.slot_) {
              _local_198 = iVar55;
              local_188 = cVar45;
              __assert_fail("(seq.index() <= capacity() && \"full table!\") && \"Try enabling sanitizers.\""
                            ,
                            "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                            ,0xf7d,
                            "std::pair<iterator, bool> absl::container_internal::raw_hash_set<absl::container_internal::FlatHashSetPolicy<const google::protobuf::Descriptor *>, google::protobuf::(anonymous namespace)::DescriptorsByNameHash<google::protobuf::Descriptor>, google::protobuf::(anonymous namespace)::DescriptorsByNameEq<google::protobuf::Descriptor>, std::allocator<const google::protobuf::Descriptor *>>::find_or_prepare_insert_non_soo(const K &) [Policy = absl::container_internal::FlatHashSetPolicy<const google::protobuf::Descriptor *>, Hash = google::protobuf::(anonymous namespace)::DescriptorsByNameHash<google::protobuf::Descriptor>, Eq = google::protobuf::(anonymous namespace)::DescriptorsByNameEq<google::protobuf::Descriptor>, Alloc = std::allocator<const google::protobuf::Descriptor *>, K = const google::protobuf::Descriptor *]"
                           );
            }
            uVar48 = (ulong)((long)local_168.field_1.slot_ + uVar48 + 0x10) & sVar40;
          }
          else {
            if (ppDVar38 == (slot_type *)0x0) goto LAB_003a2bb5;
            pcVar39 = absl::lts_20250127::container_internal::
                      raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::Descriptor_*>,_google::protobuf::(anonymous_namespace)::DescriptorsByNameHash<google::protobuf::Descriptor>,_google::protobuf::(anonymous_namespace)::DescriptorsByNameEq<google::protobuf::Descriptor>,_std::allocator<const_google::protobuf::Descriptor_*>_>
                      ::control((raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::Descriptor_*>,_google::protobuf::(anonymous_namespace)::DescriptorsByNameHash<google::protobuf::Descriptor>,_google::protobuf::(anonymous_namespace)::DescriptorsByNameEq<google::protobuf::Descriptor>,_std::allocator<const_google::protobuf::Descriptor_*>_>
                                 *)&local_158);
            bVar35 = absl::lts_20250127::container_internal::ShouldInsertBackwardsForDebug
                               ((size_t)ppDVar38,(size_t)common,pcVar39);
            aVar41 = local_168.field_1;
            if (bVar35) {
              uVar6 = 0xf;
              if (uVar36 != 0) {
                for (; uVar36 >> uVar6 == 0; uVar6 = uVar6 - 1) {
                }
              }
              uVar43 = (ushort)((uVar6 ^ 0xfff0) + 0x11) - 1;
            }
            else {
              uVar43 = 0;
              if (uVar36 != 0) {
                for (; (uVar36 >> uVar43 & 1) == 0; uVar43 = uVar43 + 1) {
                }
              }
            }
            target.probe_length =
                 (size_t)absl::lts_20250127::container_internal::
                         raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::Descriptor_const*>,google::protobuf::(anonymous_namespace)::DescriptorsByNameHash<google::protobuf::Descriptor>,google::protobuf::(anonymous_namespace)::DescriptorsByNameEq<google::protobuf::Descriptor>,std::allocator<google::protobuf::Descriptor_const*>>
                         ::GetPolicyFunctions()::value;
            target.offset = (size_t)local_168.field_1.slot_;
            i = absl::lts_20250127::container_internal::PrepareInsertNonSoo
                          ((container_internal *)&local_158,common,uVar43 + uVar48 & sVar40,target,
                           in_R9);
            iVar55 = absl::lts_20250127::container_internal::
                     raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::Descriptor_*>,_google::protobuf::(anonymous_namespace)::DescriptorsByNameHash<google::protobuf::Descriptor>,_google::protobuf::(anonymous_namespace)::DescriptorsByNameEq<google::protobuf::Descriptor>,_std::allocator<const_google::protobuf::Descriptor_*>_>
                     ::iterator_at((raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::Descriptor_*>,_google::protobuf::(anonymous_namespace)::DescriptorsByNameHash<google::protobuf::Descriptor>,_google::protobuf::(anonymous_namespace)::DescriptorsByNameEq<google::protobuf::Descriptor>,_std::allocator<const_google::protobuf::Descriptor_*>_>
                                    *)&local_158,i);
            cVar45 = '\x01';
          }
          message = local_170;
          lVar50 = local_118;
        } while (uVar36 == 0);
      }
LAB_003a23b0:
      local_188 = cVar45;
      _local_198 = iVar55;
      sVar40 = local_158.capacity_;
      puVar47 = (undefined1 *)&local_158;
      if (local_188 == '\x01') {
        local_110 = local_198;
        local_180 = local_198;
        local_178.slot_ = local_190.slot_;
        local_158.capacity_ = 0xffffffffffffff9c;
        local_c0.slot_ = local_190.slot_;
        *local_190.slot_ = (slot_type)local_168.ctrl_;
        absl::lts_20250127::container_internal::CommonFields::set_capacity
                  ((CommonFields *)puVar47,sVar40);
        aVar41.slot_ = absl::lts_20250127::container_internal::
                       raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::Descriptor_*>,_google::protobuf::(anonymous_namespace)::DescriptorsByNameHash<google::protobuf::Descriptor>,_google::protobuf::(anonymous_namespace)::DescriptorsByNameEq<google::protobuf::Descriptor>,_std::allocator<const_google::protobuf::Descriptor_*>_>
                       ::iterator::operator*((iterator *)&local_180);
        absl::lts_20250127::container_internal::
        raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::Descriptor_const*>,google::protobuf::(anonymous_namespace)::DescriptorsByNameHash<google::protobuf::Descriptor>,google::protobuf::(anonymous_namespace)::DescriptorsByNameEq<google::protobuf::Descriptor>,std::allocator<google::protobuf::Descriptor_const*>>
        ::AssertOnFind<google::protobuf::Descriptor_const*>
                  ((raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::Descriptor_const*>,google::protobuf::(anonymous_namespace)::DescriptorsByNameHash<google::protobuf::Descriptor>,google::protobuf::(anonymous_namespace)::DescriptorsByNameEq<google::protobuf::Descriptor>,std::allocator<google::protobuf::Descriptor_const*>>
                    *)puVar47,aVar41.slot_);
        local_138.slot_ = aVar41.slot_;
        if ((slot_type *)local_158.capacity_ == (slot_type *)0x1) {
          absl::lts_20250127::container_internal::
          raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::Descriptor_*>,_google::protobuf::(anonymous_namespace)::DescriptorsByNameHash<google::protobuf::Descriptor>,_google::protobuf::(anonymous_namespace)::DescriptorsByNameEq<google::protobuf::Descriptor>,_std::allocator<const_google::protobuf::Descriptor_*>_>
          ::AssertNotDebugCapacity
                    ((raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::Descriptor_*>,_google::protobuf::(anonymous_namespace)::DescriptorsByNameHash<google::protobuf::Descriptor>,_google::protobuf::(anonymous_namespace)::DescriptorsByNameEq<google::protobuf::Descriptor>,_std::allocator<const_google::protobuf::Descriptor_*>_>
                      *)puVar47);
          aVar41 = local_138;
          if (1 < local_158.size_) {
            ppDVar38 = absl::lts_20250127::container_internal::
                       raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::Descriptor_*>,_google::protobuf::(anonymous_namespace)::DescriptorsByNameHash<google::protobuf::Descriptor>,_google::protobuf::(anonymous_namespace)::DescriptorsByNameEq<google::protobuf::Descriptor>,_std::allocator<const_google::protobuf::Descriptor_*>_>
                       ::soo_slot((raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::Descriptor_*>,_google::protobuf::(anonymous_namespace)::DescriptorsByNameHash<google::protobuf::Descriptor>,_google::protobuf::(anonymous_namespace)::DescriptorsByNameEq<google::protobuf::Descriptor>,_std::allocator<const_google::protobuf::Descriptor_*>_>
                                   *)puVar47);
            bVar35 = anon_unknown_24::DescriptorsByNameEq<google::protobuf::Descriptor>::operator()
                               ((DescriptorsByNameEq<google::protobuf::Descriptor> *)*ppDVar38,
                                *aVar41.slot_,rhs_02);
            if (bVar35) {
              aVar41.slot_ = absl::lts_20250127::container_internal::
                             raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::Descriptor_*>,_google::protobuf::(anonymous_namespace)::DescriptorsByNameHash<google::protobuf::Descriptor>,_google::protobuf::(anonymous_namespace)::DescriptorsByNameEq<google::protobuf::Descriptor>,_std::allocator<const_google::protobuf::Descriptor_*>_>
                             ::soo_slot((raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::Descriptor_*>,_google::protobuf::(anonymous_namespace)::DescriptorsByNameHash<google::protobuf::Descriptor>,_google::protobuf::(anonymous_namespace)::DescriptorsByNameEq<google::protobuf::Descriptor>,_std::allocator<const_google::protobuf::Descriptor_*>_>
                                         *)puVar47);
              puVar47 = absl::lts_20250127::container_internal::kSooControl;
              goto LAB_003a26a3;
            }
          }
          absl::lts_20250127::container_internal::
          raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::Descriptor_*>,_google::protobuf::(anonymous_namespace)::DescriptorsByNameHash<google::protobuf::Descriptor>,_google::protobuf::(anonymous_namespace)::DescriptorsByNameEq<google::protobuf::Descriptor>,_std::allocator<const_google::protobuf::Descriptor_*>_>
          ::AssertNotDebugCapacity
                    ((raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::Descriptor_*>,_google::protobuf::(anonymous_namespace)::DescriptorsByNameHash<google::protobuf::Descriptor>,_google::protobuf::(anonymous_namespace)::DescriptorsByNameEq<google::protobuf::Descriptor>,_std::allocator<const_google::protobuf::Descriptor_*>_>
                      *)puVar47);
          puVar47 = (undefined1 *)0x0;
        }
        else {
          iVar55 = _local_198;
          cVar45 = local_188;
          if ((slot_type *)local_158.capacity_ == (slot_type *)0x0) {
LAB_003a2bb5:
            local_188 = cVar45;
            _local_198 = iVar55;
            __assert_fail("cap >= kDefaultCapacity",
                          "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                          ,0xb75,
                          "size_t absl::container_internal::raw_hash_set<absl::container_internal::FlatHashSetPolicy<const google::protobuf::Descriptor *>, google::protobuf::(anonymous namespace)::DescriptorsByNameHash<google::protobuf::Descriptor>, google::protobuf::(anonymous namespace)::DescriptorsByNameEq<google::protobuf::Descriptor>, std::allocator<const google::protobuf::Descriptor *>>::capacity() const [Policy = absl::container_internal::FlatHashSetPolicy<const google::protobuf::Descriptor *>, Hash = google::protobuf::(anonymous namespace)::DescriptorsByNameHash<google::protobuf::Descriptor>, Eq = google::protobuf::(anonymous namespace)::DescriptorsByNameEq<google::protobuf::Descriptor>, Alloc = std::allocator<const google::protobuf::Descriptor *>]"
                         );
          }
          absl::lts_20250127::container_internal::
          raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::Descriptor_*>,_google::protobuf::(anonymous_namespace)::DescriptorsByNameHash<google::protobuf::Descriptor>,_google::protobuf::(anonymous_namespace)::DescriptorsByNameEq<google::protobuf::Descriptor>,_std::allocator<const_google::protobuf::Descriptor_*>_>
          ::prefetch_heap_block
                    ((raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::Descriptor_*>,_google::protobuf::(anonymous_namespace)::DescriptorsByNameHash<google::protobuf::Descriptor>,_google::protobuf::(anonymous_namespace)::DescriptorsByNameEq<google::protobuf::Descriptor>,_std::allocator<const_google::protobuf::Descriptor_*>_>
                      *)puVar47);
          puVar2 = (ushort *)((*aVar41.slot_)->all_names_).payload_;
          aVar41._2_6_ = 0;
          aVar41._0_2_ = *puVar2;
          uVar37 = absl::lts_20250127::hash_internal::MixingHashState::CombineContiguousImpl
                             (&absl::lts_20250127::hash_internal::MixingHashState::kSeed,
                              (long)puVar2 + ~(ulong)aVar41.slot_,aVar41.slot_);
          if ((slot_type *)local_158.capacity_ == (slot_type *)0x1) {
            __assert_fail("(!is_soo()) && \"Try enabling sanitizers.\"",
                          "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                          ,0xe2a,
                          "iterator absl::container_internal::raw_hash_set<absl::container_internal::FlatHashSetPolicy<const google::protobuf::Descriptor *>, google::protobuf::(anonymous namespace)::DescriptorsByNameHash<google::protobuf::Descriptor>, google::protobuf::(anonymous namespace)::DescriptorsByNameEq<google::protobuf::Descriptor>, std::allocator<const google::protobuf::Descriptor *>>::find_non_soo(const key_arg<K> &, size_t) [Policy = absl::container_internal::FlatHashSetPolicy<const google::protobuf::Descriptor *>, Hash = google::protobuf::(anonymous namespace)::DescriptorsByNameHash<google::protobuf::Descriptor>, Eq = google::protobuf::(anonymous namespace)::DescriptorsByNameEq<google::protobuf::Descriptor>, Alloc = std::allocator<const google::protobuf::Descriptor *>, K = const google::protobuf::Descriptor *]"
                         );
          }
          iVar55 = _local_198;
          cVar45 = local_188;
          if ((slot_type *)local_158.capacity_ == (slot_type *)0x0) goto LAB_003a2bb5;
          local_118 = lVar50;
          if (((ulong)(local_158.capacity_ + 1) & local_158.capacity_) != 0) {
LAB_003a2b44:
            __assert_fail("(((mask + 1) & mask) == 0 && \"not a mask\") && \"Try enabling sanitizers.\""
                          ,
                          "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                          ,0x14c,
                          "absl::container_internal::probe_seq<16>::probe_seq(size_t, size_t) [Width = 16]"
                         );
          }
          uVar46 = (uVar37 ^ (ulong)aVar41.slot_) * -0x234dd359734ecb13;
          local_108._0_8_ = local_158.capacity_;
          local_168.field_1.slot_ =
               (slot_type *)
               (((uVar46 >> 0x38 | (uVar46 & 0xff000000000000) >> 0x28 |
                  (uVar46 & 0xff0000000000) >> 0x18 | (uVar46 & 0xff00000000) >> 8 |
                  (uVar46 & 0xff000000) << 8 | (uVar46 & 0xff0000) << 0x18 |
                  (uVar46 & 0xff00) << 0x28 | uVar46 << 0x38) >> 7 ^
                (ulong)local_158.heap_or_soo_.heap.control >> 0xc) & local_158.capacity_);
          local_e8 = absl::lts_20250127::container_internal::
                     raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::Descriptor_*>,_google::protobuf::(anonymous_namespace)::DescriptorsByNameHash<google::protobuf::Descriptor>,_google::protobuf::(anonymous_namespace)::DescriptorsByNameEq<google::protobuf::Descriptor>,_std::allocator<const_google::protobuf::Descriptor_*>_>
                     ::control((raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::Descriptor_*>,_google::protobuf::(anonymous_namespace)::DescriptorsByNameHash<google::protobuf::Descriptor>,_google::protobuf::(anonymous_namespace)::DescriptorsByNameEq<google::protobuf::Descriptor>,_std::allocator<const_google::protobuf::Descriptor_*>_>
                                *)puVar47);
          uVar34 = (undefined1)(uVar46 >> 0x38);
          auVar51 = ZEXT216(CONCAT11(uVar34,uVar34) & 0x7f7f);
          auVar51 = pshuflw(auVar51,auVar51,0);
          local_48 = auVar51._0_4_;
          local_f0 = (slot_type *)0x0;
          uStack_44 = local_48;
          uStack_40 = local_48;
          uStack_3c = local_48;
          do {
            iVar56.field_1.slot_ = aVar41.slot_;
            iVar56.ctrl_ = (ctrl_t *)local_168.field_1.slot_;
            pcVar39 = local_e8 + (long)local_168.field_1.slot_;
            local_d8 = *(CommonFields **)pcVar39;
            cStack_d0 = pcVar39[8];
            cStack_cf = pcVar39[9];
            cStack_ce = pcVar39[10];
            cStack_cd = pcVar39[0xb];
            cStack_cc = pcVar39[0xc];
            cStack_cb = pcVar39[0xd];
            cStack_ca = pcVar39[0xe];
            cStack_c9 = pcVar39[0xf];
            auVar52[0] = -((ctrl_t)local_48 == *pcVar39);
            auVar52[1] = -(local_48._1_1_ == pcVar39[1]);
            auVar52[2] = -(local_48._2_1_ == pcVar39[2]);
            auVar52[3] = -(local_48._3_1_ == pcVar39[3]);
            auVar52[4] = -((ctrl_t)uStack_44 == pcVar39[4]);
            auVar52[5] = -(uStack_44._1_1_ == pcVar39[5]);
            auVar52[6] = -(uStack_44._2_1_ == pcVar39[6]);
            auVar52[7] = -(uStack_44._3_1_ == pcVar39[7]);
            auVar52[8] = -((ctrl_t)uStack_40 == cStack_d0);
            auVar52[9] = -(uStack_40._1_1_ == cStack_cf);
            auVar52[10] = -(uStack_40._2_1_ == cStack_ce);
            auVar52[0xb] = -(uStack_40._3_1_ == cStack_cd);
            auVar52[0xc] = -((ctrl_t)uStack_3c == cStack_cc);
            auVar52[0xd] = -(uStack_3c._1_1_ == cStack_cb);
            auVar52[0xe] = -(uStack_3c._2_1_ == cStack_ca);
            auVar52[0xf] = -(uStack_3c._3_1_ == cStack_c9);
            uVar36 = (ushort)(SUB161(auVar52 >> 7,0) & 1) |
                     (ushort)(SUB161(auVar52 >> 0xf,0) & 1) << 1 |
                     (ushort)(SUB161(auVar52 >> 0x17,0) & 1) << 2 |
                     (ushort)(SUB161(auVar52 >> 0x1f,0) & 1) << 3 |
                     (ushort)(SUB161(auVar52 >> 0x27,0) & 1) << 4 |
                     (ushort)(SUB161(auVar52 >> 0x2f,0) & 1) << 5 |
                     (ushort)(SUB161(auVar52 >> 0x37,0) & 1) << 6 |
                     (ushort)(SUB161(auVar52 >> 0x3f,0) & 1) << 7 |
                     (ushort)(SUB161(auVar52 >> 0x47,0) & 1) << 8 |
                     (ushort)(SUB161(auVar52 >> 0x4f,0) & 1) << 9 |
                     (ushort)(SUB161(auVar52 >> 0x57,0) & 1) << 10 |
                     (ushort)(SUB161(auVar52 >> 0x5f,0) & 1) << 0xb |
                     (ushort)(SUB161(auVar52 >> 0x67,0) & 1) << 0xc |
                     (ushort)(SUB161(auVar52 >> 0x6f,0) & 1) << 0xd |
                     (ushort)(SUB161(auVar52 >> 0x77,0) & 1) << 0xe |
                     (ushort)(auVar52[0xf] >> 7) << 0xf;
            uVar43 = (uint)uVar36;
            local_120 = (CommonFields *)puVar47;
            while (uVar36 != 0) {
              uVar5 = 0;
              if (uVar43 != 0) {
                for (; (uVar43 >> uVar5 & 1) == 0; uVar5 = uVar5 + 1) {
                }
              }
              ppDVar38 = absl::lts_20250127::container_internal::
                         raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::Descriptor_*>,_google::protobuf::(anonymous_namespace)::DescriptorsByNameHash<google::protobuf::Descriptor>,_google::protobuf::(anonymous_namespace)::DescriptorsByNameEq<google::protobuf::Descriptor>,_std::allocator<const_google::protobuf::Descriptor_*>_>
                         ::slot_array((raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::Descriptor_*>,_google::protobuf::(anonymous_namespace)::DescriptorsByNameHash<google::protobuf::Descriptor>,_google::protobuf::(anonymous_namespace)::DescriptorsByNameEq<google::protobuf::Descriptor>,_std::allocator<const_google::protobuf::Descriptor_*>_>
                                       *)&local_158);
              uVar46 = (ulong)((ulong)uVar5 + (long)local_168.field_1.slot_) & local_108._0_8_;
              bVar35 = anon_unknown_24::DescriptorsByNameEq<google::protobuf::Descriptor>::
                       operator()((DescriptorsByNameEq<google::protobuf::Descriptor> *)
                                  ppDVar38[uVar46],*local_138.slot_,rhs_01);
              auVar7._8_8_ = 0;
              auVar7._0_8_ = aVar41;
              iVar56 = (iterator)(auVar7 << 0x40);
              if (bVar35) {
                iVar56 = absl::lts_20250127::container_internal::
                         raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::Descriptor_*>,_google::protobuf::(anonymous_namespace)::DescriptorsByNameHash<google::protobuf::Descriptor>,_google::protobuf::(anonymous_namespace)::DescriptorsByNameEq<google::protobuf::Descriptor>,_std::allocator<const_google::protobuf::Descriptor_*>_>
                         ::iterator_at((raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::Descriptor_*>,_google::protobuf::(anonymous_namespace)::DescriptorsByNameHash<google::protobuf::Descriptor>,_google::protobuf::(anonymous_namespace)::DescriptorsByNameEq<google::protobuf::Descriptor>,_std::allocator<const_google::protobuf::Descriptor_*>_>
                                        *)&local_158,uVar46);
                local_120 = (CommonFields *)iVar56.ctrl_;
              }
              aVar41 = iVar56.field_1;
              if (bVar35) break;
              uVar36 = (ushort)(uVar43 - 1) & (ushort)uVar43;
              uVar43 = CONCAT22((short)(uVar43 - 1 >> 0x10),uVar36);
              auVar8._8_8_ = 0;
              auVar8._0_8_ = aVar41;
              iVar56 = (iterator)(auVar8 << 0x40);
            }
            aVar41 = iVar56.field_1;
            puVar47 = (undefined1 *)local_120;
            if (uVar36 != 0) {
              bVar35 = false;
            }
            else {
              auVar53[0] = -((char)local_d8 == -0x80);
              auVar53[1] = -(local_d8._1_1_ == -0x80);
              auVar53[2] = -(local_d8._2_1_ == -0x80);
              auVar53[3] = -(local_d8._3_1_ == -0x80);
              auVar53[4] = -(local_d8._4_1_ == -0x80);
              auVar53[5] = -(local_d8._5_1_ == -0x80);
              auVar53[6] = -(local_d8._6_1_ == -0x80);
              auVar53[7] = -(local_d8._7_1_ == -0x80);
              auVar53[8] = -(cStack_d0 == kEmpty);
              auVar53[9] = -(cStack_cf == kEmpty);
              auVar53[10] = -(cStack_ce == kEmpty);
              auVar53[0xb] = -(cStack_cd == kEmpty);
              auVar53[0xc] = -(cStack_cc == kEmpty);
              auVar53[0xd] = -(cStack_cb == kEmpty);
              auVar53[0xe] = -(cStack_ca == kEmpty);
              auVar53[0xf] = -(cStack_c9 == kEmpty);
              if ((((((((((((((((auVar53 >> 7 & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                               (auVar53 >> 0xf & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                              (auVar53 >> 0x17 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                             (auVar53 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                            (auVar53 >> 0x27 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                           (auVar53 >> 0x2f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                          (auVar53 >> 0x37 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                         (auVar53 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                        (auVar53 >> 0x47 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                       (auVar53 >> 0x4f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                      (auVar53 >> 0x57 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                     (auVar53 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                    (auVar53 >> 0x67 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                   (auVar53 >> 0x6f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                  (auVar53 >> 0x77 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                  -1 < auVar53[0xf]) {
                iVar55 = _local_198;
                cVar45 = local_188;
                if ((slot_type *)local_158.capacity_ == (slot_type *)0x0) goto LAB_003a2bb5;
                if (local_158.capacity_ < local_f0 + 2) {
                  __assert_fail("(seq.index() <= capacity() && \"full table!\") && \"Try enabling sanitizers.\""
                                ,
                                "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                                ,0xe37,
                                "iterator absl::container_internal::raw_hash_set<absl::container_internal::FlatHashSetPolicy<const google::protobuf::Descriptor *>, google::protobuf::(anonymous namespace)::DescriptorsByNameHash<google::protobuf::Descriptor>, google::protobuf::(anonymous namespace)::DescriptorsByNameEq<google::protobuf::Descriptor>, std::allocator<const google::protobuf::Descriptor *>>::find_non_soo(const key_arg<K> &, size_t) [Policy = absl::container_internal::FlatHashSetPolicy<const google::protobuf::Descriptor *>, Hash = google::protobuf::(anonymous namespace)::DescriptorsByNameHash<google::protobuf::Descriptor>, Eq = google::protobuf::(anonymous namespace)::DescriptorsByNameEq<google::protobuf::Descriptor>, Alloc = std::allocator<const google::protobuf::Descriptor *>, K = const google::protobuf::Descriptor *]"
                               );
                }
                local_168.field_1.slot_ =
                     (slot_type *)
                     ((ulong)((ctrl_t *)((long)local_168.field_1.slot_ + (long)local_f0) + 0x10) &
                     local_108._0_8_);
                bVar35 = true;
                local_f0 = local_f0 + 2;
              }
              else {
                absl::lts_20250127::container_internal::
                raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::Descriptor_*>,_google::protobuf::(anonymous_namespace)::DescriptorsByNameHash<google::protobuf::Descriptor>,_google::protobuf::(anonymous_namespace)::DescriptorsByNameEq<google::protobuf::Descriptor>,_std::allocator<const_google::protobuf::Descriptor_*>_>
                ::AssertNotDebugCapacity
                          ((raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::Descriptor_*>,_google::protobuf::(anonymous_namespace)::DescriptorsByNameHash<google::protobuf::Descriptor>,_google::protobuf::(anonymous_namespace)::DescriptorsByNameEq<google::protobuf::Descriptor>,_std::allocator<const_google::protobuf::Descriptor_*>_>
                            *)&local_158);
                bVar35 = false;
                puVar47 = (undefined1 *)(CommonFields *)0x0;
              }
            }
            message = local_170;
            lVar50 = local_118;
          } while (bVar35);
        }
LAB_003a26a3:
        local_68 = local_110;
        local_60 = local_c0;
        local_58.ctrl_ = puVar47;
        local_58.field_1 = aVar41;
        bVar35 = absl::lts_20250127::container_internal::operator==(&local_58,(iterator *)&local_68)
        ;
        if (!bVar35) {
          __assert_fail("PolicyTraits::apply(FindElement{*this}, *iter) == iter && \"constructed value does not match the lookup key\""
                        ,
                        "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                        ,0xfe2,
                        "void absl::container_internal::raw_hash_set<absl::container_internal::FlatHashSetPolicy<const google::protobuf::Descriptor *>, google::protobuf::(anonymous namespace)::DescriptorsByNameHash<google::protobuf::Descriptor>, google::protobuf::(anonymous namespace)::DescriptorsByNameEq<google::protobuf::Descriptor>, std::allocator<const google::protobuf::Descriptor *>>::emplace_at(iterator, Args &&...) [Policy = absl::container_internal::FlatHashSetPolicy<const google::protobuf::Descriptor *>, Hash = google::protobuf::(anonymous namespace)::DescriptorsByNameHash<google::protobuf::Descriptor>, Eq = google::protobuf::(anonymous namespace)::DescriptorsByNameEq<google::protobuf::Descriptor>, Alloc = std::allocator<const google::protobuf::Descriptor *>, Args = <const google::protobuf::Descriptor *const &>]"
                       );
        }
      }
      else {
        ppDVar42 = absl::lts_20250127::container_internal::
                   raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::Descriptor_*>,_google::protobuf::(anonymous_namespace)::DescriptorsByNameHash<google::protobuf::Descriptor>,_google::protobuf::(anonymous_namespace)::DescriptorsByNameEq<google::protobuf::Descriptor>,_std::allocator<const_google::protobuf::Descriptor_*>_>
                   ::iterator::operator*((iterator *)&local_198);
        if ((((*ppDVar42)->options_->field_0)._impl_.map_entry_ != false) ||
           (((*(MessageOptions **)((long)local_168.ctrl_ + 0x28))->field_0)._impl_.map_entry_ ==
            true)) {
          pcVar4 = (message->all_names_).payload_;
          element_name._M_len = (ulong)*(ushort *)(pcVar4 + 2);
          element_name._M_str = pcVar4 + ~element_name._M_len;
          local_180.slot_ = (slot_type *)&local_168;
          pcStack_70 = absl::lts_20250127::functional_internal::
                       InvokeObject<google::protobuf::DescriptorBuilder::DetectMapConflicts(google::protobuf::Descriptor_const*,google::protobuf::DescriptorProto_const&)::__0,std::__cxx11::string>
          ;
          local_78.obj = &local_180;
          make_error.invoker_ =
               absl::lts_20250127::functional_internal::
               InvokeObject<google::protobuf::DescriptorBuilder::DetectMapConflicts(google::protobuf::Descriptor_const*,google::protobuf::DescriptorProto_const&)::__0,std::__cxx11::string>
          ;
          make_error.ptr_.obj = local_78.obj;
          AddError(local_128,element_name,&local_130->super_Message,NAME,make_error);
          break;
        }
      }
      if (lVar50 < message->nested_type_count_) {
        failure_msg = (Nonnull<const_char_*>)0x0;
      }
      else {
        failure_msg = absl::lts_20250127::log_internal::MakeCheckOpString<long,long>
                                (lVar50,(long)message->nested_type_count_,
                                 "index < nested_type_count()");
      }
      if (failure_msg != (Nonnull<const_char_*>)0x0) {
        absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                  ((LogMessageFatal *)&local_180,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.h"
                   ,0xa8a,failure_msg);
        absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                  ((LogMessageFatal *)&local_180);
      }
      pDVar3 = message->nested_types_;
      proto_00 = internal::RepeatedPtrFieldBase::
                 Get<google::protobuf::internal::GenericTypeHandler<google::protobuf::DescriptorProto>>
                           (local_b8,(int)lVar50);
      DetectMapConflicts(local_128,(Descriptor *)(&pDVar3->super_SymbolBase + local_b0),proto_00);
      lVar50 = lVar50 + 1;
    } while (lVar50 < message->nested_type_count_);
  }
  if (0 < message->field_count_) {
    lVar49 = 8;
    lVar50 = 0;
    do {
      puVar2 = *(ushort **)(&message->fields_->super_SymbolBase + lVar49);
      local_180._2_6_ = 0;
      local_180._0_2_ = *puVar2;
      local_178.slot_ = (slot_type *)(~(ulong)local_180.slot_ + (long)puVar2);
      _local_198 = absl::lts_20250127::container_internal::
                   raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::Descriptor_const*>,google::protobuf::(anonymous_namespace)::DescriptorsByNameHash<google::protobuf::Descriptor>,google::protobuf::(anonymous_namespace)::DescriptorsByNameEq<google::protobuf::Descriptor>,std::allocator<google::protobuf::Descriptor_const*>>
                   ::find<std::basic_string_view<char,std::char_traits<char>>>
                             ((raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::Descriptor_const*>,google::protobuf::(anonymous_namespace)::DescriptorsByNameHash<google::protobuf::Descriptor>,google::protobuf::(anonymous_namespace)::DescriptorsByNameEq<google::protobuf::Descriptor>,std::allocator<google::protobuf::Descriptor_const*>>
                               *)&local_158,(key_arg<std::basic_string_view<char>_> *)&local_180);
      absl::lts_20250127::container_internal::
      raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::Descriptor_*>,_google::protobuf::(anonymous_namespace)::DescriptorsByNameHash<google::protobuf::Descriptor>,_google::protobuf::(anonymous_namespace)::DescriptorsByNameEq<google::protobuf::Descriptor>,_std::allocator<const_google::protobuf::Descriptor_*>_>
      ::AssertNotDebugCapacity
                ((raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::Descriptor_*>,_google::protobuf::(anonymous_namespace)::DescriptorsByNameHash<google::protobuf::Descriptor>,_google::protobuf::(anonymous_namespace)::DescriptorsByNameEq<google::protobuf::Descriptor>,_std::allocator<const_google::protobuf::Descriptor_*>_>
                  *)&local_158);
      local_180.slot_ = (slot_type *)0x0;
      bVar35 = absl::lts_20250127::container_internal::operator==
                         ((iterator *)&local_198,(iterator *)&local_180);
      if ((!bVar35) &&
         (ppDVar42 = absl::lts_20250127::container_internal::
                     raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::Descriptor_*>,_google::protobuf::(anonymous_namespace)::DescriptorsByNameHash<google::protobuf::Descriptor>,_google::protobuf::(anonymous_namespace)::DescriptorsByNameEq<google::protobuf::Descriptor>,_std::allocator<const_google::protobuf::Descriptor_*>_>
                     ::iterator::operator*((iterator *)&local_198),
         ((*ppDVar42)->options_->field_0)._impl_.map_entry_ == true)) {
        pcVar4 = (local_170->all_names_).payload_;
        element_name_00._M_len = (ulong)*(ushort *)(pcVar4 + 2);
        element_name_00._M_str = pcVar4 + ~element_name_00._M_len;
        pcStack_80 = absl::lts_20250127::functional_internal::
                     InvokeObject<google::protobuf::DescriptorBuilder::DetectMapConflicts(google::protobuf::Descriptor_const*,google::protobuf::DescriptorProto_const&)::__1,std::__cxx11::string>
        ;
        make_error_00.invoker_ =
             absl::lts_20250127::functional_internal::
             InvokeObject<google::protobuf::DescriptorBuilder::DetectMapConflicts(google::protobuf::Descriptor_const*,google::protobuf::DescriptorProto_const&)::__1,std::__cxx11::string>
        ;
        make_error_00.ptr_.obj = &local_180;
        local_180.slot_ = (slot_type *)&local_198;
        local_88.obj = &local_180;
        AddError(local_128,element_name_00,&local_130->super_Message,NAME,make_error_00);
      }
      lVar50 = lVar50 + 1;
      lVar49 = lVar49 + 0x58;
      message = local_170;
    } while (lVar50 < local_170->field_count_);
  }
  if (0 < message->enum_type_count_) {
    lVar49 = 8;
    lVar50 = 0;
    do {
      puVar2 = *(ushort **)(&message->enum_types_->super_SymbolBase + lVar49);
      local_180._2_6_ = 0;
      local_180._0_2_ = *puVar2;
      local_178.slot_ = (slot_type *)(~(ulong)local_180.slot_ + (long)puVar2);
      _local_198 = absl::lts_20250127::container_internal::
                   raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::Descriptor_const*>,google::protobuf::(anonymous_namespace)::DescriptorsByNameHash<google::protobuf::Descriptor>,google::protobuf::(anonymous_namespace)::DescriptorsByNameEq<google::protobuf::Descriptor>,std::allocator<google::protobuf::Descriptor_const*>>
                   ::find<std::basic_string_view<char,std::char_traits<char>>>
                             ((raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::Descriptor_const*>,google::protobuf::(anonymous_namespace)::DescriptorsByNameHash<google::protobuf::Descriptor>,google::protobuf::(anonymous_namespace)::DescriptorsByNameEq<google::protobuf::Descriptor>,std::allocator<google::protobuf::Descriptor_const*>>
                               *)&local_158,(key_arg<std::basic_string_view<char>_> *)&local_180);
      absl::lts_20250127::container_internal::
      raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::Descriptor_*>,_google::protobuf::(anonymous_namespace)::DescriptorsByNameHash<google::protobuf::Descriptor>,_google::protobuf::(anonymous_namespace)::DescriptorsByNameEq<google::protobuf::Descriptor>,_std::allocator<const_google::protobuf::Descriptor_*>_>
      ::AssertNotDebugCapacity
                ((raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::Descriptor_*>,_google::protobuf::(anonymous_namespace)::DescriptorsByNameHash<google::protobuf::Descriptor>,_google::protobuf::(anonymous_namespace)::DescriptorsByNameEq<google::protobuf::Descriptor>,_std::allocator<const_google::protobuf::Descriptor_*>_>
                  *)&local_158);
      local_180.slot_ = (slot_type *)0x0;
      bVar35 = absl::lts_20250127::container_internal::operator==
                         ((iterator *)&local_198,(iterator *)&local_180);
      if ((!bVar35) &&
         (ppDVar42 = absl::lts_20250127::container_internal::
                     raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::Descriptor_*>,_google::protobuf::(anonymous_namespace)::DescriptorsByNameHash<google::protobuf::Descriptor>,_google::protobuf::(anonymous_namespace)::DescriptorsByNameEq<google::protobuf::Descriptor>,_std::allocator<const_google::protobuf::Descriptor_*>_>
                     ::iterator::operator*((iterator *)&local_198),
         ((*ppDVar42)->options_->field_0)._impl_.map_entry_ == true)) {
        pcVar4 = (local_170->all_names_).payload_;
        element_name_01._M_len = (ulong)*(ushort *)(pcVar4 + 2);
        element_name_01._M_str = pcVar4 + ~element_name_01._M_len;
        pcStack_90 = absl::lts_20250127::functional_internal::
                     InvokeObject<google::protobuf::DescriptorBuilder::DetectMapConflicts(google::protobuf::Descriptor_const*,google::protobuf::DescriptorProto_const&)::__2,std::__cxx11::string>
        ;
        make_error_01.invoker_ =
             absl::lts_20250127::functional_internal::
             InvokeObject<google::protobuf::DescriptorBuilder::DetectMapConflicts(google::protobuf::Descriptor_const*,google::protobuf::DescriptorProto_const&)::__2,std::__cxx11::string>
        ;
        make_error_01.ptr_.obj = &local_180;
        local_180.slot_ = (slot_type *)&local_198;
        local_98.obj = &local_180;
        AddError(local_128,element_name_01,&local_130->super_Message,NAME,make_error_01);
      }
      lVar50 = lVar50 + 1;
      lVar49 = lVar49 + 0x58;
      message = local_170;
    } while (lVar50 < local_170->enum_type_count_);
  }
  if (0 < message->oneof_decl_count_) {
    lVar49 = 8;
    lVar50 = 0;
    do {
      puVar2 = *(ushort **)(&message->oneof_decls_->super_SymbolBase + lVar49);
      local_180._2_6_ = 0;
      local_180._0_2_ = *puVar2;
      local_178.slot_ = (slot_type *)(~(ulong)local_180.slot_ + (long)puVar2);
      _local_198 = absl::lts_20250127::container_internal::
                   raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::Descriptor_const*>,google::protobuf::(anonymous_namespace)::DescriptorsByNameHash<google::protobuf::Descriptor>,google::protobuf::(anonymous_namespace)::DescriptorsByNameEq<google::protobuf::Descriptor>,std::allocator<google::protobuf::Descriptor_const*>>
                   ::find<std::basic_string_view<char,std::char_traits<char>>>
                             ((raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<google::protobuf::Descriptor_const*>,google::protobuf::(anonymous_namespace)::DescriptorsByNameHash<google::protobuf::Descriptor>,google::protobuf::(anonymous_namespace)::DescriptorsByNameEq<google::protobuf::Descriptor>,std::allocator<google::protobuf::Descriptor_const*>>
                               *)&local_158,(key_arg<std::basic_string_view<char>_> *)&local_180);
      absl::lts_20250127::container_internal::
      raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::Descriptor_*>,_google::protobuf::(anonymous_namespace)::DescriptorsByNameHash<google::protobuf::Descriptor>,_google::protobuf::(anonymous_namespace)::DescriptorsByNameEq<google::protobuf::Descriptor>,_std::allocator<const_google::protobuf::Descriptor_*>_>
      ::AssertNotDebugCapacity
                ((raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::Descriptor_*>,_google::protobuf::(anonymous_namespace)::DescriptorsByNameHash<google::protobuf::Descriptor>,_google::protobuf::(anonymous_namespace)::DescriptorsByNameEq<google::protobuf::Descriptor>,_std::allocator<const_google::protobuf::Descriptor_*>_>
                  *)&local_158);
      local_180.slot_ = (slot_type *)0x0;
      bVar35 = absl::lts_20250127::container_internal::operator==
                         ((iterator *)&local_198,(iterator *)&local_180);
      if ((!bVar35) &&
         (ppDVar42 = absl::lts_20250127::container_internal::
                     raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::Descriptor_*>,_google::protobuf::(anonymous_namespace)::DescriptorsByNameHash<google::protobuf::Descriptor>,_google::protobuf::(anonymous_namespace)::DescriptorsByNameEq<google::protobuf::Descriptor>,_std::allocator<const_google::protobuf::Descriptor_*>_>
                     ::iterator::operator*((iterator *)&local_198),
         ((*ppDVar42)->options_->field_0)._impl_.map_entry_ == true)) {
        pcVar4 = (local_170->all_names_).payload_;
        element_name_02._M_len = (ulong)*(ushort *)(pcVar4 + 2);
        element_name_02._M_str = pcVar4 + ~element_name_02._M_len;
        pcStack_a0 = absl::lts_20250127::functional_internal::
                     InvokeObject<google::protobuf::DescriptorBuilder::DetectMapConflicts(google::protobuf::Descriptor_const*,google::protobuf::DescriptorProto_const&)::__3,std::__cxx11::string>
        ;
        make_error_02.invoker_ =
             absl::lts_20250127::functional_internal::
             InvokeObject<google::protobuf::DescriptorBuilder::DetectMapConflicts(google::protobuf::Descriptor_const*,google::protobuf::DescriptorProto_const&)::__3,std::__cxx11::string>
        ;
        make_error_02.ptr_.obj = &local_180;
        local_180.slot_ = (slot_type *)&local_198;
        local_a8.obj = &local_180;
        AddError(local_128,element_name_02,&local_130->super_Message,NAME,make_error_02);
      }
      lVar50 = lVar50 + 1;
      lVar49 = lVar49 + 0x38;
      message = local_170;
    } while (lVar50 < local_170->oneof_decl_count_);
  }
  absl::lts_20250127::container_internal::
  raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::Descriptor_*>,_google::protobuf::(anonymous_namespace)::DescriptorsByNameHash<google::protobuf::Descriptor>,_google::protobuf::(anonymous_namespace)::DescriptorsByNameEq<google::protobuf::Descriptor>,_std::allocator<const_google::protobuf::Descriptor_*>_>
  ::~raw_hash_set((raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::Descriptor_*>,_google::protobuf::(anonymous_namespace)::DescriptorsByNameHash<google::protobuf::Descriptor>,_google::protobuf::(anonymous_namespace)::DescriptorsByNameEq<google::protobuf::Descriptor>,_std::allocator<const_google::protobuf::Descriptor_*>_>
                   *)&local_158);
  return;
}

Assistant:

void DescriptorBuilder::DetectMapConflicts(const Descriptor* message,
                                           const DescriptorProto& proto) {
  DescriptorsByNameSet<Descriptor> seen_types;
  for (int i = 0; i < message->nested_type_count(); ++i) {
    const Descriptor* nested = message->nested_type(i);
    auto insert_result = seen_types.insert(nested);
    bool inserted = insert_result.second;
    if (!inserted) {
      if ((*insert_result.first)->options().map_entry() ||
          nested->options().map_entry()) {
        AddError(message->full_name(), proto,
                 DescriptorPool::ErrorCollector::NAME, [&] {
                   return absl::StrCat(
                       "Expanded map entry type ", nested->name(),
                       " conflicts with an existing nested message type.");
                 });
        break;
      }
    }
    // Recursively test on the nested types.
    DetectMapConflicts(message->nested_type(i), proto.nested_type(i));
  }
  // Check for conflicted field names.
  for (int i = 0; i < message->field_count(); ++i) {
    const FieldDescriptor* field = message->field(i);
    auto iter = seen_types.find(field->name());
    if (iter != seen_types.end() && (*iter)->options().map_entry()) {
      AddError(message->full_name(), proto,
               DescriptorPool::ErrorCollector::NAME, [&] {
                 return absl::StrCat("Expanded map entry type ",
                                     (*iter)->name(),
                                     " conflicts with an existing field.");
               });
    }
  }
  // Check for conflicted enum names.
  for (int i = 0; i < message->enum_type_count(); ++i) {
    const EnumDescriptor* enum_desc = message->enum_type(i);
    auto iter = seen_types.find(enum_desc->name());
    if (iter != seen_types.end() && (*iter)->options().map_entry()) {
      AddError(message->full_name(), proto,
               DescriptorPool::ErrorCollector::NAME, [&] {
                 return absl::StrCat("Expanded map entry type ",
                                     (*iter)->name(),
                                     " conflicts with an existing enum type.");
               });
    }
  }
  // Check for conflicted oneof names.
  for (int i = 0; i < message->oneof_decl_count(); ++i) {
    const OneofDescriptor* oneof_desc = message->oneof_decl(i);
    auto iter = seen_types.find(oneof_desc->name());
    if (iter != seen_types.end() && (*iter)->options().map_entry()) {
      AddError(message->full_name(), proto,
               DescriptorPool::ErrorCollector::NAME, [&] {
                 return absl::StrCat("Expanded map entry type ",
                                     (*iter)->name(),
                                     " conflicts with an existing oneof type.");
               });
    }
  }
}